

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O2

FT_Error ps_unicodes_init(FT_Memory memory,PS_Unicodes table,FT_UInt num_glyphs,
                         PS_GetGlyphNameFunc get_glyph_name,PS_FreeGlyphNameFunc free_glyph_name,
                         FT_Pointer glyph_data)

{
  PS_Unicodes pPVar1;
  FT_Pointer pvVar2;
  FT_Error FVar3;
  int iVar4;
  FT_UInt32 FVar5;
  char *__s2;
  long lVar6;
  PS_UniMap *P;
  long lVar7;
  undefined4 in_register_00000014;
  undefined8 uVar8;
  FT_UInt FVar9;
  uint uVar10;
  PS_UniMap *pPVar11;
  ulong uVar12;
  FT_Error local_cc;
  PS_GetGlyphNameFunc local_c8;
  PS_UniMap *local_c0;
  undefined8 local_b8;
  PS_FreeGlyphNameFunc local_b0;
  ulong local_a8;
  FT_Memory local_a0;
  PS_Unicodes local_98;
  FT_Pointer local_90;
  FT_UInt extra_glyph_list_states [10];
  FT_UInt extra_glyphs [10];
  
  uVar8 = CONCAT44(in_register_00000014,num_glyphs);
  extra_glyph_list_states[4] = 0;
  extra_glyph_list_states[5] = 0;
  extra_glyph_list_states[6] = 0;
  extra_glyph_list_states[7] = 0;
  extra_glyph_list_states[0] = 0;
  extra_glyph_list_states[1] = 0;
  extra_glyph_list_states[2] = 0;
  extra_glyph_list_states[3] = 0;
  extra_glyph_list_states[8] = 0;
  extra_glyph_list_states[9] = 0;
  table->num_maps = 0;
  FVar9 = 0;
  local_c8 = get_glyph_name;
  local_b0 = free_glyph_name;
  local_90 = glyph_data;
  local_c0 = (PS_UniMap *)ft_mem_qrealloc(memory,8,0,(ulong)(num_glyphs + 10),(void *)0x0,&local_cc)
  ;
  pvVar2 = local_90;
  table->maps = local_c0;
  local_b8 = uVar8;
  local_a8 = (ulong)(num_glyphs + 10);
  local_a0 = memory;
  local_98 = table;
  if (local_cc == 0) {
    for (; pPVar1 = local_98, FVar9 != (uint)uVar8; FVar9 = FVar9 + 1) {
      __s2 = (*local_c8)(pvVar2,FVar9);
      if ((__s2 != (char *)0x0) && (*__s2 != '\0')) {
        lVar6 = 0;
        do {
          lVar7 = lVar6;
          if (lVar7 == 0x28) goto LAB_001fd268;
          iVar4 = strcmp("Delta" + *(int *)((long)ft_extra_glyph_name_offsets + lVar7),__s2);
          lVar6 = lVar7 + 4;
        } while (iVar4 != 0);
        if (*(int *)((long)extra_glyph_list_states + lVar7) == 0) {
          *(undefined4 *)((long)extra_glyph_list_states + lVar7) = 1;
          *(FT_UInt *)((long)extra_glyphs + lVar7) = FVar9;
        }
LAB_001fd268:
        FVar5 = ps_unicode_value(__s2);
        uVar8 = local_b8;
        if ((FVar5 & 0x7fffffff) != 0) {
          lVar6 = 0;
          do {
            lVar7 = lVar6;
            if (lVar7 == 0x28) goto LAB_001fd2a7;
            lVar6 = lVar7 + 4;
          } while (*(FT_UInt32 *)((long)ft_extra_glyph_unicodes + lVar7) != FVar5);
          *(undefined4 *)((long)extra_glyph_list_states + lVar7) = 2;
LAB_001fd2a7:
          local_c0->unicode = FVar5;
          local_c0->glyph_index = FVar9;
          local_c0 = local_c0 + 1;
        }
        if (local_b0 != (PS_FreeGlyphNameFunc)0x0) {
          (*local_b0)(pvVar2,__s2);
        }
      }
    }
    pPVar11 = local_c0;
    for (lVar6 = 0; lVar6 != 0x28; lVar6 = lVar6 + 4) {
      if (*(int *)((long)extra_glyph_list_states + lVar6) == 1) {
        pPVar11->unicode = *(FT_UInt32 *)((long)ft_extra_glyph_unicodes + lVar6);
        pPVar11->glyph_index = *(FT_UInt *)((long)extra_glyphs + lVar6);
        pPVar11 = pPVar11 + 1;
      }
    }
    P = local_98->maps;
    uVar12 = (ulong)((long)pPVar11 - (long)P) >> 3;
    uVar10 = (uint)uVar12;
    if (uVar10 == 0) {
      ft_mem_free(local_a0,P);
      pPVar1->maps = (PS_UniMap *)0x0;
      FVar3 = 0xa3;
      if (local_cc != 0) {
        FVar3 = local_cc;
      }
    }
    else {
      uVar12 = uVar12 & 0xffffffff;
      if (uVar10 < (uint)uVar8 >> 1) {
        P = (PS_UniMap *)ft_mem_qrealloc(local_a0,8,local_a8,uVar12,P,&local_cc);
        pPVar1->maps = P;
        local_cc = 0;
      }
      qsort(P,uVar12,8,compare_uni_maps);
      FVar3 = local_cc;
    }
    local_cc = FVar3;
    pPVar1->num_maps = uVar10;
  }
  return local_cc;
}

Assistant:

static FT_Error
  ps_unicodes_init( FT_Memory             memory,
                    PS_Unicodes           table,
                    FT_UInt               num_glyphs,
                    PS_GetGlyphNameFunc   get_glyph_name,
                    PS_FreeGlyphNameFunc  free_glyph_name,
                    FT_Pointer            glyph_data )
  {
    FT_Error  error;

    FT_UInt  extra_glyph_list_states[] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
    FT_UInt  extra_glyphs[EXTRA_GLYPH_LIST_SIZE];


    /* we first allocate the table */
    table->num_maps = 0;

    if ( !FT_QNEW_ARRAY( table->maps, num_glyphs + EXTRA_GLYPH_LIST_SIZE ) )
    {
      FT_UInt     n;
      FT_UInt     count;
      PS_UniMap*  map;
      FT_UInt32   uni_char;


      map = table->maps;

      for ( n = 0; n < num_glyphs; n++ )
      {
        const char*  gname = get_glyph_name( glyph_data, n );


        if ( gname && *gname )
        {
          ps_check_extra_glyph_name( gname, n,
                                     extra_glyphs, extra_glyph_list_states );
          uni_char = ps_unicode_value( gname );

          if ( BASE_GLYPH( uni_char ) != 0 )
          {
            ps_check_extra_glyph_unicode( uni_char,
                                          extra_glyph_list_states );
            map->unicode     = uni_char;
            map->glyph_index = n;
            map++;
          }

          if ( free_glyph_name )
            free_glyph_name( glyph_data, gname );
        }
      }

      for ( n = 0; n < EXTRA_GLYPH_LIST_SIZE; n++ )
      {
        if ( extra_glyph_list_states[n] == 1 )
        {
          /* This glyph name has an additional representation. */
          /* Add it to the cmap.                               */

          map->unicode     = ft_extra_glyph_unicodes[n];
          map->glyph_index = extra_glyphs[n];
          map++;
        }
      }

      /* now compress the table a bit */
      count = (FT_UInt)( map - table->maps );

      if ( count == 0 )
      {
        /* No unicode chars here! */
        FT_FREE( table->maps );
        if ( !error )
          error = FT_THROW( No_Unicode_Glyph_Name );
      }
      else
      {
        /* Reallocate if the number of used entries is much smaller. */
        if ( count < num_glyphs / 2 )
        {
          FT_MEM_QRENEW_ARRAY( table->maps,
                               num_glyphs + EXTRA_GLYPH_LIST_SIZE,
                               count );
          error = FT_Err_Ok;
        }

        /* Sort the table in increasing order of unicode values, */
        /* taking care of glyph variants.                        */
        ft_qsort( table->maps, count, sizeof ( PS_UniMap ),
                  compare_uni_maps );
      }

      table->num_maps = count;
    }

    return error;
  }